

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RepeatLoopStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RepeatLoopStatement,slang::ast::Expression_const&,slang::ast::Statement_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,Statement *args_1,SourceRange *args_2)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  RepeatLoopStatement *pRVar3;
  
  pRVar3 = (RepeatLoopStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RepeatLoopStatement *)this->endPtr < pRVar3 + 1) {
    pRVar3 = (RepeatLoopStatement *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pRVar3 + 1);
  }
  SVar1 = args_2->startLoc;
  SVar2 = args_2->endLoc;
  (pRVar3->super_Statement).kind = RepeatLoop;
  (pRVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pRVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pRVar3->super_Statement).sourceRange.endLoc = SVar2;
  pRVar3->count = args;
  pRVar3->body = args_1;
  return pRVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }